

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe3At4(uint8_t *buf)

{
  undefined8 local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  local_18 = (long)((int)(uint)*buf >> 1) & 7;
  if (local_18 >> 2 != 0) {
    local_18 = local_18 | 0xfffffffffffffff8;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntBe3At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= (buf[0] >> 1);
    res &= UINT64_C(0x7);

    if (res >> 2) {
        res |= UINT64_C(0xfffffffffffffff8);
    }

    return static_cast<std::int64_t>(res);
}